

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

int __thiscall testing::UnitTest::total_test_count(UnitTest *this)

{
  int iVar1;
  
  iVar1 = internal::UnitTestImpl::total_test_count(this->impl_);
  return iVar1;
}

Assistant:

int UnitTest::total_test_count() const { return impl()->total_test_count(); }